

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCodes.h
# Opt level: O1

void __thiscall
jbcoin::RPC::ErrorInfo::ErrorInfo
          (ErrorInfo *this,error_code_i code_,string *token_,string *message_)

{
  pointer pcVar1;
  
  this->code = code_;
  (this->token)._M_dataplus._M_p = (pointer)&(this->token).field_2;
  pcVar1 = (token_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->token,pcVar1,pcVar1 + token_->_M_string_length);
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pcVar1 = (message_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message,pcVar1,pcVar1 + message_->_M_string_length);
  return;
}

Assistant:

ErrorInfo (error_code_i code_, std::string const& token_,
        std::string const& message_)
        : code (code_)
        , token (token_)
        , message (message_)
    { }